

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O1

void __thiscall xatlas::internal::segment::Atlas::resetCharts(Atlas *this)

{
  uint8_t *puVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint8_t *puVar4;
  Chart *chart;
  ulong uVar5;
  char *__function;
  ulong uVar6;
  long lVar7;
  
  uVar6 = (ulong)(this->m_mesh->m_indices).m_base.size;
  uVar5 = uVar6 / 3;
  if (2 < uVar6) {
    puVar4 = (this->m_faceCharts).m_base.buffer;
    uVar6 = 0;
    do {
      if ((this->m_faceCharts).m_base.size <= uVar6) {
        __function = "T &xatlas::internal::Array<int>::operator[](uint32_t) [T = int]";
        goto LAB_001b102c;
      }
      puVar1 = puVar4 + uVar6 * 4;
      puVar1[0] = 0xff;
      puVar1[1] = 0xff;
      puVar1[2] = 0xff;
      puVar1[3] = 0xff;
      uVar6 = uVar6 + 1;
    } while (uVar5 != uVar6);
  }
  this->m_facesLeft = (uint32_t)uVar5;
  uVar2 = (this->m_charts).m_base.size;
  if (uVar2 != 0) {
    lVar7 = 0;
    do {
      if ((this->m_charts).m_base.size <= (uint)lVar7) {
        __function = 
        "T &xatlas::internal::Array<xatlas::internal::segment::Chart *>::operator[](uint32_t) [T = xatlas::internal::segment::Chart *]"
        ;
LAB_001b102c:
        __assert_fail("index < m_base.size",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                      ,0x4ae,__function);
      }
      chart = *(Chart **)((this->m_charts).m_base.buffer + lVar7 * 8);
      uVar3 = (chart->seeds).m_base.size;
      if (uVar3 == 0) {
        __assert_fail("!isEmpty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                      ,0x4b4,
                      "const T &xatlas::internal::Array<unsigned int>::back() const [T = unsigned int]"
                     );
      }
      uVar3 = *(uint32_t *)((chart->seeds).m_base.buffer + (ulong)(uVar3 - 1) * 4);
      (chart->faces).m_base.size = 0;
      (chart->candidates).m_pairs.m_base.size = 0;
      (chart->failedPlanarRegions).m_base.size = 0;
      (chart->basis).tangent.x = 0.0;
      (chart->basis).tangent.y = 0.0;
      *(undefined8 *)&(chart->basis).tangent.z = 0;
      (chart->basis).bitangent.y = 0.0;
      (chart->basis).bitangent.z = 0.0;
      (chart->basis).normal.x = 0.0;
      (chart->basis).normal.y = 0.0;
      *(undefined8 *)&(chart->basis).normal.z = 0;
      chart->boundaryLength = 0.0;
      (chart->centroidSum).x = 0.0;
      (chart->centroidSum).y = 0.0;
      (chart->centroidSum).z = 0.0;
      (chart->centroid).x = 0.0;
      (chart->centroid).y = 0.0;
      (chart->centroid).z = 0.0;
      addFaceToChart(this,chart,uVar3);
      lVar7 = lVar7 + 1;
    } while (uVar2 != (uint32_t)lVar7);
  }
  return;
}

Assistant:

void resetCharts()
	{
		XA_PROFILE_START(buildAtlasResetCharts)
		const uint32_t faceCount = m_mesh->faceCount();
		for (uint32_t i = 0; i < faceCount; i++)
			m_faceCharts[i] = -1;
		m_facesLeft = faceCount;
		const uint32_t chartCount = m_charts.size();
		for (uint32_t i = 0; i < chartCount; i++) {
			Chart *chart = m_charts[i];
			const uint32_t seed = chart->seeds.back();
			chart->area = 0.0f;
			chart->boundaryLength = 0.0f;
			chart->basis.normal = Vector3(0.0f);
			chart->basis.tangent = Vector3(0.0f);
			chart->basis.bitangent = Vector3(0.0f);
			chart->centroidSum = Vector3(0.0f);
			chart->centroid = Vector3(0.0f);
			chart->faces.clear();
			chart->candidates.clear();
			chart->failedPlanarRegions.clear();
			addFaceToChart(chart, seed);
		}
		XA_PROFILE_END(buildAtlasResetCharts)
	}